

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall QMessageBox::keyPressEvent(QMessageBox *this,QKeyEvent *e)

{
  uint uVar1;
  QAbstractButton *this_00;
  bool bVar2;
  QAbstractButton **ppQVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  EVP_PKEY_CTX *src;
  long lVar7;
  EVP_PKEY_CTX *dst;
  StandardKey SVar8;
  long lVar9;
  long in_FS_OFFSET;
  QKeySequence shortcut;
  undefined1 *local_60;
  QList<QAbstractButton_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  SVar8 = (StandardKey)e;
  cVar4 = QKeyEvent::matches(SVar8);
  if (cVar4 == '\0') {
    dst = (EVP_PKEY_CTX *)0x9;
    cVar4 = QKeyEvent::matches(SVar8);
    if (cVar4 == '\0') {
      cVar4 = QKeyEvent::matches(SVar8);
      if (((cVar4 == '\0') || (lVar9 = *(long *)(lVar7 + 0x340), lVar9 == 0)) ||
         ((*(byte *)(*(long *)(lVar9 + 0x20) + 9) & 0x80) == 0)) goto LAB_005030a3;
      QTextEdit::selectAll(*(QTextEdit **)(lVar9 + 0x30));
    }
    else {
      lVar9 = *(long *)(lVar7 + 0x340);
      if (((lVar9 == 0) || ((*(byte *)(*(long *)(lVar9 + 0x20) + 9) & 0x80) == 0)) ||
         (*(char *)(lVar9 + 0x28) != '\x01')) {
LAB_005030a3:
        uVar6 = QKeyEvent::modifiers();
        if (((uVar6 & 0x1c000000) == 0) && (uVar1 = *(uint *)(e + 0x40), (uVar1 & 0x1ffffff) != 0))
        {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
          QDialogButtonBox::buttons(&local_58,*(QDialogButtonBox **)(lVar7 + 0x2f8));
          ppQVar3 = local_58.d.ptr;
          bVar2 = true;
          if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
            lVar7 = local_58.d.size << 3;
            lVar9 = 0;
            do {
              this_00 = *(QAbstractButton **)((long)ppQVar3 + lVar9);
              local_60 = &DAT_aaaaaaaaaaaaaaaa;
              QAbstractButton::shortcut((QAbstractButton *)&local_60);
              cVar4 = QKeySequence::isEmpty();
              if ((cVar4 == '\0') &&
                 (uVar5 = QKeySequence::operator[]((uint)(QKeySequence *)&local_60),
                 (uVar1 & 0x1ffffff) == (uVar5 & 0x1ffffff))) {
                QAbstractButton::animateClick(this_00);
                QKeySequence::~QKeySequence((QKeySequence *)&local_60);
                bVar2 = false;
                goto LAB_005031ee;
              }
              QKeySequence::~QKeySequence((QKeySequence *)&local_60);
              lVar9 = lVar9 + 8;
            } while (lVar7 != lVar9);
            bVar2 = true;
          }
LAB_005031ee:
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
            }
          }
          if (!bVar2) goto LAB_005030bd;
        }
        QDialog::keyPressEvent(&this->super_QDialog,e);
        goto LAB_005030bd;
      }
      QTextEdit::copy(*(QTextEdit **)(lVar9 + 0x30),dst,src);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*(long *)e + 0x10))(e,1);
      return;
    }
  }
  else {
    if (*(QAbstractButton **)(lVar7 + 0x350) != (QAbstractButton *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QAbstractButton::click(*(QAbstractButton **)(lVar7 + 0x350));
        return;
      }
      goto LAB_0050321f;
    }
LAB_005030bd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
LAB_0050321f:
  __stack_chk_fail();
}

Assistant:

void QMessageBox::keyPressEvent(QKeyEvent *e)
{
#if QT_CONFIG(shortcut)
        Q_D(QMessageBox);
        if (e->matches(QKeySequence::Cancel)) {
            if (d->detectedEscapeButton) {
#ifdef Q_OS_MAC
                d->detectedEscapeButton->animateClick();
#else
                d->detectedEscapeButton->click();
#endif
            }
            return;
        }
#endif // QT_CONFIG(shortcut)

#if !defined(QT_NO_CLIPBOARD) && !defined(QT_NO_SHORTCUT)

#if QT_CONFIG(textedit)
        if (e == QKeySequence::Copy) {
            if (d->detailsText && d->detailsText->isVisible() && d->detailsText->copy()) {
                e->setAccepted(true);
                return;
            }
        } else if (e == QKeySequence::SelectAll && d->detailsText && d->detailsText->isVisible()) {
            d->detailsText->selectAll();
            e->setAccepted(true);
            return;
        }
#endif // QT_CONFIG(textedit)

#if defined(Q_OS_WIN)
        if (e == QKeySequence::Copy) {
            const auto separator = "---------------------------\n"_L1;
            QString textToCopy;
            textToCopy += separator + windowTitle() + u'\n' + separator // title
                          + d->label->text() + u'\n' + separator;       // text

            if (d->informativeLabel)
                textToCopy += d->informativeLabel->text() + u'\n' + separator;

            const QList<QAbstractButton *> buttons = d->buttonBox->buttons();
            for (const auto *button : buttons)
                textToCopy += button->text() + "   "_L1;
            textToCopy += u'\n' + separator;
#if QT_CONFIG(textedit)
            if (d->detailsText)
                textToCopy += d->detailsText->text() + u'\n' + separator;
#endif
            QGuiApplication::clipboard()->setText(textToCopy);
            return;
        }
#endif // Q_OS_WIN

#endif // !QT_NO_CLIPBOARD && !QT_NO_SHORTCUT

#ifndef QT_NO_SHORTCUT
    if (!(e->modifiers() & (Qt::AltModifier | Qt::ControlModifier | Qt::MetaModifier))) {
        int key = e->key() & ~Qt::MODIFIER_MASK;
        if (key) {
            const QList<QAbstractButton *> buttons = d->buttonBox->buttons();
            for (auto *pb : buttons) {
                QKeySequence shortcut = pb->shortcut();
                if (!shortcut.isEmpty() && key == shortcut[0].key()) {
                    pb->animateClick();
                    return;
                }
            }
        }
    }
#endif
    QDialog::keyPressEvent(e);
}